

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-stroker.c
# Opt level: O0

PVG_FT_Bool
ft_conic_is_small_enough(PVG_FT_Vector *base,PVG_FT_Angle *angle_in,PVG_FT_Angle *angle_out)

{
  long dx;
  long dy;
  long dx_00;
  long dy_00;
  PVG_FT_Angle PVar1;
  PVG_FT_Pos PVar2;
  bool local_54;
  bool local_52;
  PVG_FT_Int close2;
  PVG_FT_Int close1;
  PVG_FT_Angle theta;
  PVG_FT_Vector d2;
  PVG_FT_Vector d1;
  PVG_FT_Angle *angle_out_local;
  PVG_FT_Angle *angle_in_local;
  PVG_FT_Vector *base_local;
  
  dx = base[1].x - base[2].x;
  dy = base[1].y - base[2].y;
  dx_00 = base->x - base[1].x;
  dy_00 = base->y - base[1].y;
  local_52 = false;
  if ((-2 < dx) && (local_52 = false, dx < 2)) {
    local_52 = -2 < dy && dy < 2;
  }
  local_54 = false;
  if ((-2 < dx_00) && (local_54 = false, dx_00 < 2)) {
    local_54 = -2 < dy_00 && dy_00 < 2;
  }
  if (local_52) {
    if (!local_54) {
      PVar1 = PVG_FT_Atan2(dx_00,dy_00);
      *angle_out = PVar1;
      *angle_in = PVar1;
    }
  }
  else if (local_54) {
    PVar1 = PVG_FT_Atan2(dx,dy);
    *angle_out = PVar1;
    *angle_in = PVar1;
  }
  else {
    PVar1 = PVG_FT_Atan2(dx,dy);
    *angle_in = PVar1;
    PVar1 = PVG_FT_Atan2(dx_00,dy_00);
    *angle_out = PVar1;
  }
  PVar1 = PVG_FT_Angle_Diff(*angle_in,*angle_out);
  PVar2 = ft_pos_abs(PVar1);
  return PVar2 < 0x1e0000;
}

Assistant:

static PVG_FT_Bool ft_conic_is_small_enough(PVG_FT_Vector* base,
                                           PVG_FT_Angle*  angle_in,
                                           PVG_FT_Angle*  angle_out)
{
    PVG_FT_Vector d1, d2;
    PVG_FT_Angle  theta;
    PVG_FT_Int    close1, close2;

    d1.x = base[1].x - base[2].x;
    d1.y = base[1].y - base[2].y;
    d2.x = base[0].x - base[1].x;
    d2.y = base[0].y - base[1].y;

    close1 = PVG_FT_IS_SMALL(d1.x) && PVG_FT_IS_SMALL(d1.y);
    close2 = PVG_FT_IS_SMALL(d2.x) && PVG_FT_IS_SMALL(d2.y);

    if (close1) {
        if (close2) {
            /* basically a point;                      */
            /* do nothing to retain original direction */
        } else {
            *angle_in = *angle_out = PVG_FT_Atan2(d2.x, d2.y);
        }
    } else /* !close1 */
    {
        if (close2) {
            *angle_in = *angle_out = PVG_FT_Atan2(d1.x, d1.y);
        } else {
            *angle_in = PVG_FT_Atan2(d1.x, d1.y);
            *angle_out = PVG_FT_Atan2(d2.x, d2.y);
        }
    }

    theta = ft_pos_abs(PVG_FT_Angle_Diff(*angle_in, *angle_out));

    return PVG_FT_BOOL(theta < PVG_FT_SMALL_CONIC_THRESHOLD);
}